

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_10::checkOverflowAndEditsError
                  (int32_t destIndex,int32_t destCapacity,Edits *edits,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  Edits *edits_local;
  int32_t destCapacity_local;
  int32_t destIndex_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    if (destCapacity < destIndex) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else if (edits != (Edits *)0x0) {
      Edits::copyErrorTo(edits,errorCode);
    }
  }
  return destIndex;
}

Assistant:

int32_t checkOverflowAndEditsError(int32_t destIndex, int32_t destCapacity,
                                   Edits *edits, UErrorCode &errorCode) {
    if (U_SUCCESS(errorCode)) {
        if (destIndex > destCapacity) {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
        } else if (edits != NULL) {
            edits->copyErrorTo(errorCode);
        }
    }
    return destIndex;
}